

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O0

void __thiscall TcpSocketImpl::SelectThread(TcpSocketImpl *this)

{
  BaseSocket *pBVar1;
  int iVar2;
  int32_t iVar3;
  bool bVar4;
  int iVar5;
  memory_order mVar6;
  __int_type _Var7;
  type pcVar8;
  ssize_t sVar9;
  uchar *__args;
  type __result;
  int *piVar10;
  atomic_uchar *this_00;
  TcpSocket *local_300;
  TcpSocket *local_2b0;
  int local_264;
  uchar cExpected;
  TcpSocket *local_258;
  TcpSocket *pTcpSocket_1;
  duration<long,_std::ratio<1L,_1000L>_> local_248;
  type local_240;
  thread local_228;
  lock_guard<std::mutex> local_220;
  lock_guard<std::mutex> lock_1;
  lock_guard<std::mutex> lock;
  __array tmp;
  bool local_1fd;
  int iRet;
  bool bZeroReceived;
  TcpSocket *pTStack_1f8;
  int iError;
  TcpSocket *pTcpSocket;
  duration<long,_std::ratio<1L,_1000L>_> local_1e8;
  int local_1e0 [2];
  int32_t transferred;
  socklen_t iLen;
  fd_set *__arr_1;
  __fd_mask *p_Stack_1c8;
  uint __i_1;
  fd_set *__arr;
  undefined1 auStack_1b8 [4];
  uint __i;
  timeval timeout;
  fd_set errorfd;
  fd_set readfd;
  int local_94;
  duration<long,_std::ratio<1L,_1000L>_> local_90;
  unique_ptr<char[],_std::default_delete<char[]>_> local_88;
  __array buf;
  undefined1 local_78 [7];
  bool bSocketShutDown;
  mutex mxNotify;
  bool bReadCall;
  TcpSocketImpl *this_local;
  bool local_26;
  
  std::__atomic_base<unsigned_char>::operator&=
            (&(this->super_BaseSocketImpl).m_iShutDownState.super___atomic_base<unsigned_char>,0xfe)
  ;
  mxNotify.super___mutex_base._M_mutex.__size[0x27] = '\0';
  std::mutex::mutex((mutex *)local_78);
  buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl._7_1_ = 0;
  std::make_unique<char[]>((size_t)&local_88);
LAB_001318c7:
  do {
    if (((this->super_BaseSocketImpl).m_bStop & 1U) != 0) {
LAB_00132471:
      if ((((buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
             super__Head_base<0UL,_char_*,_false>._M_head_impl._7_1_ & 1) == 0) &&
          ((this->super_BaseSocketImpl).m_iError == 0)) &&
         (((this->super_BaseSocketImpl).m_fSock != -1 &&
          (iVar5 = shutdown((this->super_BaseSocketImpl).m_fSock,0), iVar5 != 0)))) {
        piVar10 = __errno_location();
        (this->super_BaseSocketImpl).m_iError = *piVar10;
        (this->super_BaseSocketImpl).m_iErrLoc = 8;
      }
      while ((mxNotify.super___mutex_base._M_mutex.__size[0x27] & 1U) == 1) {
        local_264 = 10;
        std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                  ((duration<long,std::ratio<1l,1000l>> *)&stack0xfffffffffffffda0,&local_264);
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)&stack0xfffffffffffffda0);
      }
      std::mutex::lock((mutex *)local_78);
      std::mutex::unlock((mutex *)local_78);
      this_00 = &(this->super_BaseSocketImpl).m_iShutDownState;
      std::__atomic_base<unsigned_char>::operator|=
                (&this_00->super___atomic_base<unsigned_char>,'\x01');
      mVar6 = std::__cmpexch_failure_order(memory_order_seq_cst);
      switch(0x1326a6) {
      default:
        if (mVar6 - memory_order_consume < 2) {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        else if (mVar6 == memory_order_seq_cst) {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        else {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        break;
      case 2:
        if (mVar6 - memory_order_consume < 2) {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        else if (mVar6 == memory_order_seq_cst) {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        else {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        break;
      case 3:
        if (mVar6 - memory_order_consume < 2) {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        else if (mVar6 == memory_order_seq_cst) {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        else {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        break;
      case 4:
        if (mVar6 - memory_order_consume < 2) {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        else if (mVar6 == memory_order_seq_cst) {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
        else {
          LOCK();
          local_26 = (this_00->super___atomic_base<unsigned_char>)._M_i == '\a';
          if (local_26) {
            (this_00->super___atomic_base<unsigned_char>)._M_i = '\x0f';
          }
          UNLOCK();
        }
      }
      if (local_26) {
        if ((this->super_BaseSocketImpl).m_fSock != -1) {
          close((this->super_BaseSocketImpl).m_fSock);
          (this->super_BaseSocketImpl).m_fSock = -1;
        }
        (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x10])();
        if ((this->m_pRefServSocket != (TcpServer *)0x0) || ((this->m_bSelfDelete & 1U) == 1)) {
          (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0x16])();
        }
      }
      std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&local_88);
      return;
    }
    _Var7 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)&this->m_atInBytes);
    if (_Var7 < 0x80001) {
      memset(errorfd.fds_bits + 0xf,0,0x80);
      memset(&timeout.tv_usec,0,0x80);
      memset(auStack_1b8,0,0x10);
      _auStack_1b8 = 2;
      timeout.tv_sec = 0;
      p_Stack_1c8 = errorfd.fds_bits + 0xf;
      for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
        p_Stack_1c8[__arr._4_4_] = 0;
      }
      _transferred = &timeout.tv_usec;
      for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
        _transferred[__arr_1._4_4_] = 0;
      }
      iVar5 = (this->super_BaseSocketImpl).m_fSock;
      iVar2 = iVar5;
      if (iVar5 < 0) {
        iVar2 = iVar5 + 0x3f;
      }
      errorfd.fds_bits[(long)(iVar2 >> 6) + 0xf] =
           errorfd.fds_bits[(long)(iVar2 >> 6) + 0xf] | 1L << ((ulong)(byte)iVar5 & 0x3f);
      iVar5 = (this->super_BaseSocketImpl).m_fSock;
      iVar2 = iVar5;
      if (iVar5 < 0) {
        iVar2 = iVar5 + 0x3f;
      }
      errorfd.fds_bits[(long)(iVar2 >> 6) + -1] =
           errorfd.fds_bits[(long)(iVar2 >> 6) + -1] | 1L << ((ulong)(byte)iVar5 & 0x3f);
      iVar5 = select((this->super_BaseSocketImpl).m_fSock + 1,(fd_set *)(errorfd.fds_bits + 0xf),
                     (fd_set *)0x0,(fd_set *)&timeout.tv_usec,(timeval *)auStack_1b8);
      if (0 < iVar5) {
        if ((errorfd.fds_bits[(long)((this->super_BaseSocketImpl).m_fSock / 0x40) + -1] &
            1L << ((byte)((long)(this->super_BaseSocketImpl).m_fSock % 0x40) & 0x3f)) != 0) {
          local_1e0[1] = 4;
          getsockopt((this->super_BaseSocketImpl).m_fSock,1,4,&(this->super_BaseSocketImpl).m_iError
                     ,(socklen_t *)(local_1e0 + 1));
          (this->super_BaseSocketImpl).m_iErrLoc = 5;
          bVar4 = std::function::operator_cast_to_bool
                            ((function *)&(this->super_BaseSocketImpl).m_fErrorParam);
          if ((bVar4) && (((this->super_BaseSocketImpl).m_bStop & 1U) == 0)) {
            std::function<void_(BaseSocket_*,_void_*)>::operator()
                      (&(this->super_BaseSocketImpl).m_fErrorParam,
                       (this->super_BaseSocketImpl).m_pBkRef,
                       (this->super_BaseSocketImpl).m_pvUserData);
          }
          else {
            bVar4 = std::function::operator_cast_to_bool
                              ((function *)&(this->super_BaseSocketImpl).m_fError);
            if ((bVar4) && (((this->super_BaseSocketImpl).m_bStop & 1U) == 0)) {
              std::function<void_(BaseSocket_*)>::operator()
                        (&(this->super_BaseSocketImpl).m_fError,
                         (this->super_BaseSocketImpl).m_pBkRef);
            }
          }
          goto LAB_00132471;
        }
        if ((errorfd.fds_bits[(long)((this->super_BaseSocketImpl).m_fSock / 0x40) + 0xf] &
            1L << ((byte)((long)(this->super_BaseSocketImpl).m_fSock % 0x40) & 0x3f)) != 0) {
          do {
            iVar5 = (this->super_BaseSocketImpl).m_fSock;
            pcVar8 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[](&local_88,0);
            sVar9 = recv(iVar5,pcVar8,0xffff,0);
            local_1e0[0] = (int)sVar9;
            if (local_1e0[0] < 1) {
              if (local_1e0[0] == 0) {
                iVar5 = shutdown((this->super_BaseSocketImpl).m_fSock,0);
                if (iVar5 != 0) {
                  piVar10 = __errno_location();
                  (this->super_BaseSocketImpl).m_iError = *piVar10;
                  (this->super_BaseSocketImpl).m_iErrLoc = 6;
                }
                buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                super__Head_base<0UL,_char_*,_false>._M_head_impl._7_1_ = 1;
                while ((mxNotify.super___mutex_base._M_mutex.__size[0x27] & 1U) == 1) {
                  pTcpSocket._4_4_ = 10;
                  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                            ((duration<long,std::ratio<1l,1000l>> *)&local_1e8,
                             (int *)((long)&pTcpSocket + 4));
                  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_1e8);
                }
                pBVar1 = (this->super_BaseSocketImpl).m_pBkRef;
                if (pBVar1 == (BaseSocket *)0x0) {
                  local_2b0 = (TcpSocket *)0x0;
                }
                else {
                  local_2b0 = (TcpSocket *)
                              __dynamic_cast(pBVar1,&BaseSocket::typeinfo,&TcpSocket::typeinfo,0);
                }
                pTStack_1f8 = local_2b0;
                bVar4 = std::function::operator_cast_to_bool
                                  ((function *)&this->m_fBytesReceivedParam);
                if ((bVar4) && (pTStack_1f8 != (TcpSocket *)0x0)) {
                  std::function<void_(TcpSocket_*,_void_*)>::operator()
                            (&this->m_fBytesReceivedParam,pTStack_1f8,
                             (this->super_BaseSocketImpl).m_pvUserData);
                }
                else {
                  bVar4 = std::function::operator_cast_to_bool((function *)&this->m_fBytesReceived);
                  if ((bVar4) && (pTStack_1f8 != (TcpSocket *)0x0)) {
                    std::function<void_(TcpSocket_*)>::operator()
                              (&this->m_fBytesReceived,pTStack_1f8);
                  }
                }
              }
              else {
                piVar10 = __errno_location();
                iRet = *piVar10;
                if (iRet != 0xb) {
                  (this->super_BaseSocketImpl).m_iError = iRet;
                  (this->super_BaseSocketImpl).m_iErrLoc = 7;
                  bVar4 = std::function::operator_cast_to_bool
                                    ((function *)&(this->super_BaseSocketImpl).m_fErrorParam);
                  if ((bVar4) && (((this->super_BaseSocketImpl).m_bStop & 1U) == 0)) {
                    std::function<void_(BaseSocket_*,_void_*)>::operator()
                              (&(this->super_BaseSocketImpl).m_fErrorParam,
                               (this->super_BaseSocketImpl).m_pBkRef,
                               (this->super_BaseSocketImpl).m_pvUserData);
                  }
                  else {
                    bVar4 = std::function::operator_cast_to_bool
                                      ((function *)&(this->super_BaseSocketImpl).m_fError);
                    if ((bVar4) && (((this->super_BaseSocketImpl).m_bStop & 1U) == 0)) {
                      std::function<void_(BaseSocket_*)>::operator()
                                (&(this->super_BaseSocketImpl).m_fError,
                                 (this->super_BaseSocketImpl).m_pBkRef);
                    }
                  }
                }
              }
              break;
            }
            local_1fd = false;
            tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
            _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
            super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ = 0;
            bVar4 = std::operator==(&this->m_fnSslDecode,(nullptr_t)0x0);
            if (bVar4) {
LAB_00131fa5:
              bVar4 = std::operator!=(&BaseSocketImpl::s_fTrafficDebug,(nullptr_t)0x0);
              if (bVar4) {
                iVar3 = (this->super_BaseSocketImpl).m_fSock;
                pcVar8 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                                   (&local_88,0);
                std::function<void_(unsigned_short,_const_char_*,_unsigned_long,_bool)>::operator()
                          (&BaseSocketImpl::s_fTrafficDebug,(unsigned_short)iVar3,pcVar8,
                           (long)local_1e0[0],false);
              }
              std::make_unique<unsigned_char[]>((size_t)&lock);
              pcVar8 = std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                                 (&local_88,0);
              iVar5 = local_1e0[0];
              __result = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                         operator[]((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                     *)&lock,0);
              std::copy_n<char*,int,unsigned_char*>(pcVar8,iVar5,__result);
              std::lock_guard<std::mutex>::lock_guard(&lock_1,&this->m_mxInDeque);
              std::
              deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
              ::
              emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,int&>
                        ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long>>>
                          *)&this->m_quInData,
                         (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&lock
                         ,local_1e0);
              std::__atomic_base<unsigned_long>::operator+=
                        (&(this->m_atInBytes).super___atomic_base<unsigned_long>,(long)local_1e0[0])
              ;
              std::lock_guard<std::mutex>::~lock_guard(&lock_1);
              std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
                        ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&lock
                        );
            }
            else {
              __args = (uchar *)std::unique_ptr<char[],_std::default_delete<char[]>_>::operator[]
                                          (&local_88,0);
              tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
              _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
              super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ =
                   std::function<int_(const_unsigned_char_*,_unsigned_long,_bool_&)>::operator()
                             (&this->m_fnSslDecode,__args,(long)local_1e0[0],&local_1fd);
              if (tmp._M_t.
                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ == 0)
              goto LAB_00131fa5;
            }
            bVar4 = std::function::operator_cast_to_bool((function *)&this->m_fBytesReceived);
            if ((((bVar4) ||
                 (bVar4 = std::function::operator_cast_to_bool
                                    ((function *)&this->m_fBytesReceivedParam), bVar4)) &&
                (((this->super_BaseSocketImpl).m_bStop & 1U) == 0)) &&
               (tmp._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl._4_4_ != -1)) {
              std::lock_guard<std::mutex>::lock_guard(&local_220,(mutex_type *)local_78);
              if ((mxNotify.super___mutex_base._M_mutex.__size[0x27] & 1U) == 0) {
                mxNotify.super___mutex_base._M_mutex.__size[0x27] = '\x01';
                local_240.mxNotify = (mutex *)local_78;
                local_240.bReadCall = (bool *)((long)&mxNotify.super___mutex_base._M_mutex + 0x27);
                local_240.this = this;
                std::thread::thread<TcpSocketImpl::SelectThread()::__0,,void>(&local_228,&local_240)
                ;
                std::thread::detach();
                std::thread::~thread(&local_228);
              }
              std::lock_guard<std::mutex>::~lock_guard(&local_220);
            }
            if ((local_1fd & 1U) == 1) {
              iVar5 = shutdown((this->super_BaseSocketImpl).m_fSock,0);
              if (iVar5 != 0) {
                piVar10 = __errno_location();
                (this->super_BaseSocketImpl).m_iError = *piVar10;
                (this->super_BaseSocketImpl).m_iErrLoc = 0xe;
              }
              buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
              super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
              super__Head_base<0UL,_char_*,_false>._M_head_impl._7_1_ = 1;
              while ((mxNotify.super___mutex_base._M_mutex.__size[0x27] & 1U) == 1) {
                pTcpSocket_1._4_4_ = 10;
                std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
                          ((duration<long,std::ratio<1l,1000l>> *)&local_248,
                           (int *)((long)&pTcpSocket_1 + 4));
                std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_248);
              }
              pBVar1 = (this->super_BaseSocketImpl).m_pBkRef;
              if (pBVar1 == (BaseSocket *)0x0) {
                local_300 = (TcpSocket *)0x0;
              }
              else {
                local_300 = (TcpSocket *)
                            __dynamic_cast(pBVar1,&BaseSocket::typeinfo,&TcpSocket::typeinfo,0);
              }
              local_258 = local_300;
              bVar4 = std::function::operator_cast_to_bool((function *)&this->m_fBytesReceivedParam)
              ;
              if ((bVar4) && (local_258 != (TcpSocket *)0x0)) {
                std::function<void_(TcpSocket_*,_void_*)>::operator()
                          (&this->m_fBytesReceivedParam,local_258,
                           (this->super_BaseSocketImpl).m_pvUserData);
              }
              else {
                bVar4 = std::function::operator_cast_to_bool((function *)&this->m_fBytesReceived);
                if ((bVar4) && (local_258 != (TcpSocket *)0x0)) {
                  std::function<void_(TcpSocket_*)>::operator()(&this->m_fBytesReceived,local_258);
                }
              }
            }
            bVar4 = false;
            if (((((this->super_BaseSocketImpl).m_bStop & 1U) == 0) &&
                (bVar4 = false, (this->super_BaseSocketImpl).m_fSock != -1)) &&
               (bVar4 = false, (this->super_BaseSocketImpl).m_iError == 0)) {
              bVar4 = (buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                       super__Head_base<0UL,_char_*,_false>._M_head_impl._7_1_ & 1) == 0;
            }
          } while (bVar4);
          if ((((buf._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl._7_1_ & 1) == 1) ||
              (((this->super_BaseSocketImpl).m_iError != 0 &&
               ((this->super_BaseSocketImpl).m_iError != 0xb)))) ||
             ((this->super_BaseSocketImpl).m_fSock == -1)) goto LAB_00132471;
        }
      }
      goto LAB_001318c7;
    }
    local_94 = 1;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_90,&local_94);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_90);
  } while( true );
}

Assistant:

void TcpSocketImpl::SelectThread()
{
    m_iShutDownState &= static_cast<uint8_t>(~1);

    bool bReadCall = false;
    mutex mxNotify;
    bool bSocketShutDown = false;
	auto buf = make_unique<char[]>(0x0000ffff);

    while (m_bStop == false)
    {
        if (m_atInBytes > 0x80000)  // More than 512 KB in the receive buffer
        {
            this_thread::sleep_for(chrono::milliseconds(1));
            continue;
        }

        fd_set readfd{}, errorfd{};
        struct timeval timeout{};

        timeout.tv_sec = 2;
        timeout.tv_usec = 0;
        FD_ZERO(&readfd);
        FD_ZERO(&errorfd);

        FD_SET(m_fSock, &readfd);
        FD_SET(m_fSock, &errorfd);

        if (::select(static_cast<int>(m_fSock + 1), &readfd, nullptr, &errorfd, &timeout) > 0)
        {
            if (FD_ISSET(m_fSock, &errorfd))
            {
                socklen_t iLen = sizeof(m_iError);
                getsockopt(m_fSock, SOL_SOCKET, SO_ERROR, reinterpret_cast<char*>(&m_iError), &iLen);
                m_iErrLoc = 5;
                if (m_fErrorParam && m_bStop == false)
                    m_fErrorParam(m_pBkRef, m_pvUserData);
                else if (m_fError && m_bStop == false)
                    m_fError(m_pBkRef);
                break;
            }

            if (FD_ISSET(m_fSock, &readfd))
            {
                do
                {
                    int32_t transferred = ::recv(m_fSock, &buf[0], 0x0000ffff, 0);

                    if (transferred <= 0)
                    {
                        if (transferred == 0)
                        {   // The connection was shutdown from the other side, there will be no more bytes to read on that connection
                            // We set the flag, so we don't read on the connection any more

                            if (::shutdown(m_fSock, SD_RECEIVE) != 0)
                            {
                                m_iError = WSAGetLastError();// OutputDebugString(L"Error shutdown socket\r\n");
                                m_iErrLoc = 6;
                            }
                            bSocketShutDown = true;

                            while (bReadCall == true)
                                this_thread::sleep_for(chrono::milliseconds(10));

                            TcpSocket* pTcpSocket = dynamic_cast<TcpSocket*>(m_pBkRef);
                            if (m_fBytesReceivedParam && pTcpSocket != nullptr)
                                m_fBytesReceivedParam(pTcpSocket, m_pvUserData);
                            else if (m_fBytesReceived && pTcpSocket != nullptr)
                                m_fBytesReceived(pTcpSocket);
                        }
                        else
                        {
                            const int iError = WSAGetLastError();
                            if (iError != WSAEWOULDBLOCK)
                            {
                                m_iError = iError;
                                m_iErrLoc = 7;
                                if (m_fErrorParam && m_bStop == false)
                                    m_fErrorParam(m_pBkRef, m_pvUserData);
                                else if (m_fError && m_bStop == false)
                                    m_fError(m_pBkRef);
                            }
                        }
                        break;
                    }
                    else
                    {
                        bool bZeroReceived = false;
                        int iRet = 0;
                        if (m_fnSslDecode == nullptr || (iRet = m_fnSslDecode(reinterpret_cast<const uint8_t*>(&buf[0]), transferred, bZeroReceived), iRet == 0))
                        {
                            if (s_fTrafficDebug != nullptr)
                                s_fTrafficDebug(static_cast<uint16_t>(m_fSock), &buf[0], transferred, false);

                            auto tmp = make_unique<uint8_t[]>(transferred);
                            copy_n(&buf[0], transferred, &tmp[0]);
                            lock_guard<mutex> lock(m_mxInDeque);
                            m_quInData.emplace_back(move(tmp), transferred);
                            m_atInBytes += transferred;
                        }

                        if ((m_fBytesReceived || m_fBytesReceivedParam) && m_bStop == false && iRet != -1)
                        {
                            lock_guard<mutex> lock(mxNotify);
                            if (bReadCall == false)
                            {
                                bReadCall = true;
                                thread([&]()
                                {
                                    mxNotify.lock();
                                    m_mxInDeque.lock();
                                    while (m_atInBytes > 0 && m_bStop == false)
                                    {
                                        m_mxInDeque.unlock();
                                        mxNotify.unlock();
                                        TcpSocket* pTcpSocket = dynamic_cast<TcpSocket*>(m_pBkRef);
                                        if (m_fBytesReceivedParam != nullptr && pTcpSocket != nullptr)
                                            m_fBytesReceivedParam(pTcpSocket, m_pvUserData);
                                        else if (m_fBytesReceived != nullptr && pTcpSocket != nullptr)
                                            m_fBytesReceived(pTcpSocket);
                                        mxNotify.lock();
                                        m_mxInDeque.lock();
                                    }
                                    bReadCall = false;
                                    m_mxInDeque.unlock();
                                    mxNotify.unlock();
                                }).detach();
                            }
                        }

                        if (bZeroReceived == true)
                        {
                            if (::shutdown(m_fSock, SD_RECEIVE) != 0)
                            {
                                m_iError = WSAGetLastError();// OutputDebugString(L"Error shutdown socket\r\n");
                                m_iErrLoc = 14;
                            }
                            bSocketShutDown = true;

                            while (bReadCall == true)
                                this_thread::sleep_for(chrono::milliseconds(10));

                            TcpSocket* pTcpSocket = dynamic_cast<TcpSocket*>(m_pBkRef);
                            if (m_fBytesReceivedParam && pTcpSocket != nullptr)
                                m_fBytesReceivedParam(pTcpSocket, m_pvUserData);
                            else if (m_fBytesReceived && pTcpSocket != nullptr)
                                m_fBytesReceived(pTcpSocket);
                        }
                    }
                } while (m_bStop == false && m_fSock != INVALID_SOCKET && m_iError == 0 && bSocketShutDown == false);

                if (bSocketShutDown == true || (m_iError != 0 && m_iError != WSAEWOULDBLOCK) || m_fSock == INVALID_SOCKET)
                    break;
            }
        }// if select
    }//while

    // if we are here, bStop is set,or m_iShutDownState has bit 1 set, or we have an error

    if (bSocketShutDown == false && m_iError == 0 && m_fSock != INVALID_SOCKET)
    {
        if (::shutdown(m_fSock, SD_RECEIVE) != 0)
        {
            m_iError = WSAGetLastError();// OutputDebugString(L"Error RECEIVE shutdown socket\r\n");
            m_iErrLoc = 8;
        }
    }

    while (bReadCall == true)
        this_thread::sleep_for(chrono::milliseconds(10));

    mxNotify.lock();    // in rare cases, bReadCall was set to false, and the task switch
    mxNotify.unlock();  // ended that thread before the lambda thread released mxNotify -> crash

    m_iShutDownState |= 1;

    unsigned char cExpected = 7;
    if (m_iShutDownState.compare_exchange_strong(cExpected, 15) == true)
    {
        if (m_fSock != INVALID_SOCKET)
        {
            ::closesocket(m_fSock);
            m_fSock = INVALID_SOCKET;
        }

        StartClosingCB();

        // if it is a auto-delete class we start the auto-delete thread now
        if (m_pRefServSocket != nullptr || m_bSelfDelete == true)    // Auto-delete, socket created from server socket
             Delete();// thread([&]() { delete this; }).detach();
    }
}